

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void op_flat_append(c2m_ctx_t c2m_ctx,node_t_conflict n,node_t_conflict op)

{
  node_t pnVar1;
  node_t pnVar2;
  tpname_t el;
  tpname_t el_00;
  int iVar3;
  anon_union_16_10_0af5b411_for_u *paVar4;
  node_t pnVar5;
  node_t pnVar6;
  node_t pnVar7;
  undefined8 extraout_RDX;
  node_t_conflict pnVar8;
  c2m_ctx_t res;
  undefined4 in_R8D;
  undefined4 uStack_3c;
  
  if (op->code != N_LIST) {
    op_append(c2m_ctx,n,op);
    return;
  }
  pnVar7 = (op->u).ops.head;
  if (pnVar7 != (node_t)0x0) {
    pnVar6 = (node_t)&op->u;
    pnVar8 = n;
    res = c2m_ctx;
    do {
      pnVar1 = (pnVar7->op_link).prev;
      pnVar2 = (pnVar7->op_link).next;
      if (pnVar1 == (node_t)0x0) {
        paVar4 = (anon_union_16_10_0af5b411_for_u *)pnVar6;
        if ((node_t_conflict)((str_t *)pnVar6)->s != pnVar7) goto LAB_00197550;
      }
      else {
        paVar4 = (anon_union_16_10_0af5b411_for_u *)&(pnVar1->op_link).next;
      }
      (paVar4->ops).head = pnVar2;
      pnVar5 = (pnVar7->op_link).next;
      if (pnVar5 == (node_t)0x0) {
        if ((node_t_conflict)(op->u).s.len != pnVar7) {
          op_flat_append_cold_2();
          pnVar6 = pnVar5;
LAB_00197550:
          op_flat_append_cold_1();
          pnVar7 = pnVar8[10].op_link.prev;
          el._20_4_ = uStack_3c;
          el.typedef_p = in_R8D;
          el.scope = pnVar6;
          el.id = (node_t_conflict)extraout_RDX;
          iVar3 = HTAB_tpname_t_do((HTAB_tpname_t *)(pnVar7->u).ops.head,el,HTAB_FIND,
                                   (tpname_t *)res);
          if (iVar3 == 0) {
            el_00._20_4_ = uStack_3c;
            el_00.typedef_p = in_R8D;
            el_00.scope = pnVar6;
            el_00.id = (node_t_conflict)extraout_RDX;
            HTAB_tpname_t_do((HTAB_tpname_t *)(pnVar7->u).ops.head,el_00,HTAB_INSERT,(tpname_t *)res
                            );
          }
          return;
        }
        (op->u).ops.tail = pnVar1;
      }
      else {
        (pnVar5->op_link).prev = pnVar1;
      }
      (pnVar7->op_link).prev = (node_t)0x0;
      (pnVar7->op_link).next = (node_t)0x0;
      pnVar8 = n;
      res = c2m_ctx;
      op_append(c2m_ctx,n,pnVar7);
      pnVar7 = pnVar2;
    } while (pnVar2 != (node_t)0x0);
  }
  return;
}

Assistant:

static void op_flat_append (c2m_ctx_t c2m_ctx, node_t n, node_t op) {
  if (op->code != N_LIST) {
    op_append (c2m_ctx, n, op);
    return;
  }
  for (node_t next_el, el = NL_HEAD (op->u.ops); el != NULL; el = next_el) {
    next_el = NL_NEXT (el);
    NL_REMOVE (op->u.ops, el);
    op_append (c2m_ctx, n, el);
  }
}